

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FormatString.hpp
# Opt level: O1

void Diligent::
     FormatStrSS<std::__cxx11::stringstream,char[28],unsigned_int,char[2],unsigned_int,char[44],char_const*,char[8],unsigned_int,char[9],unsigned_int,char[3]>
               (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *ss,
               char (*FirstArg) [28],uint *RestArgs,char (*RestArgs_1) [2],uint *RestArgs_2,
               char (*RestArgs_3) [44],char **RestArgs_4,char (*RestArgs_5) [8],uint *RestArgs_6,
               char (*RestArgs_7) [9],uint *RestArgs_8,char (*RestArgs_9) [3])

{
  size_t sVar1;
  
  sVar1 = strlen(*FirstArg);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)(ss + 0x10),*FirstArg,sVar1);
  std::ostream::_M_insert<unsigned_long>((ulong)(ss + 0x10));
  FormatStrSS<std::__cxx11::stringstream,char[2],unsigned_int,char[44],char_const*,char[8],unsigned_int,char[9],unsigned_int,char[3]>
            (ss,RestArgs_1,RestArgs_2,RestArgs_3,RestArgs_4,RestArgs_5,RestArgs_6,RestArgs_7,
             RestArgs_8,RestArgs_9);
  return;
}

Assistant:

void FormatStrSS(SSType& ss, const FirstArgType& FirstArg, const RestArgsType&... RestArgs)
{
    FormatStrSS(ss, FirstArg);
    FormatStrSS(ss, RestArgs...); // recursive call using pack expansion syntax
}